

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# registry.h
# Opt level: O1

shared_ptr<ut::setup_impl<agge::tests::PreciseDeltaTests>,_unsigned_int> __thiscall
ut::registry::get_setup<agge::tests::PreciseDeltaTests>(registry *this)

{
  _Base_ptr p_Var1;
  iterator iVar2;
  undefined8 extraout_RDX;
  uint *extraout_RDX_00;
  uint *extraout_RDX_01;
  uint *extraout_RDX_02;
  uint *extraout_RDX_03;
  uint *extraout_RDX_04;
  uint *extraout_RDX_05;
  uint *extraout_RDX_06;
  uint *extraout_RDX_07;
  uint *puVar3;
  uint *extraout_RDX_08;
  uint *extraout_RDX_09;
  long in_RSI;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ut::shared_ptr<ut::destructible,_unsigned_int>_>_>,_bool>
  pVar4;
  shared_ptr<ut::setup_impl<agge::tests::PreciseDeltaTests>,_unsigned_int> sVar5;
  string id;
  destructible *local_e8;
  uint *puStack_e0;
  undefined1 *local_d0;
  long local_c8;
  undefined1 local_c0 [16];
  destructible *local_b0;
  uint *puStack_a8;
  value_type local_a0;
  undefined1 *local_70;
  long local_68;
  undefined1 local_60 [16];
  key_type local_50;
  
  agge::tests::PreciseDeltaTests::__suite_id_abi_cxx11_();
  iVar2 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ut::shared_ptr<ut::destructible,_unsigned_int>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ut::shared_ptr<ut::destructible,_unsigned_int>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ut::shared_ptr<ut::destructible,_unsigned_int>_>_>_>
          ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ut::shared_ptr<ut::destructible,_unsigned_int>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ut::shared_ptr<ut::destructible,_unsigned_int>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ut::shared_ptr<ut::destructible,_unsigned_int>_>_>_>
                  *)(in_RSI + 0x48),&local_50);
  pVar4._8_8_ = extraout_RDX;
  pVar4.first._M_node = iVar2._M_node;
  if (iVar2._M_node == (_Base_ptr)(in_RSI + 0x50)) {
    local_70 = local_60;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_70,local_50._M_dataplus._M_p,
               local_50._M_dataplus._M_p + local_50._M_string_length);
    local_e8 = (destructible *)operator_new(0x38);
    local_e8->_vptr_destructible = (_func_int **)&PTR__setup_impl_001c1da0;
    local_e8[1]._vptr_destructible = (_func_int **)0x0;
    local_e8[2]._vptr_destructible = (_func_int **)0x0;
    local_e8[3]._vptr_destructible = (_func_int **)0x0;
    local_e8[4]._vptr_destructible = (_func_int **)0x0;
    local_e8[5]._vptr_destructible = (_func_int **)0x0;
    local_e8[6]._vptr_destructible = (_func_int **)0x0;
    puStack_e0 = (uint *)operator_new(4);
    *puStack_e0 = 1;
    local_d0 = local_c0;
    std::__cxx11::string::_M_construct<char*>((string *)&local_d0,local_70,local_70 + local_68);
    if (puStack_e0 != (uint *)0x0) {
      *puStack_e0 = *puStack_e0 + 1;
    }
    local_a0.first._M_dataplus._M_p = (pointer)&local_a0.first.field_2;
    local_b0 = local_e8;
    puStack_a8 = puStack_e0;
    std::__cxx11::string::_M_construct<char*>((string *)&local_a0,local_d0,local_d0 + local_c8);
    local_a0.second._ptr = local_b0;
    local_a0.second._refcount = puStack_a8;
    if (puStack_a8 != (uint *)0x0) {
      *puStack_a8 = *puStack_a8 + 1;
    }
    pVar4 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ut::shared_ptr<ut::destructible,_unsigned_int>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ut::shared_ptr<ut::destructible,_unsigned_int>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ut::shared_ptr<ut::destructible,_unsigned_int>_>_>_>
            ::_M_insert_unique((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ut::shared_ptr<ut::destructible,_unsigned_int>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ut::shared_ptr<ut::destructible,_unsigned_int>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ut::shared_ptr<ut::destructible,_unsigned_int>_>_>_>
                                *)(in_RSI + 0x48),&local_a0);
  }
  puVar3 = pVar4._8_8_;
  if (iVar2._M_node == (_Base_ptr)(in_RSI + 0x50)) {
    if ((local_a0.second._refcount != (uint *)0x0) &&
       (*local_a0.second._refcount = *local_a0.second._refcount - 1, *local_a0.second._refcount == 0
       )) {
      if (local_a0.second._ptr != (destructible *)0x0) {
        (*(local_a0.second._ptr)->_vptr_destructible[1])();
        puVar3 = extraout_RDX_00;
      }
      if (local_a0.second._refcount != (uint *)0x0) {
        operator_delete(local_a0.second._refcount);
        puVar3 = extraout_RDX_01;
      }
    }
    local_a0.second._ptr = (destructible *)0x0;
    local_a0.second._refcount = (uint *)0x0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0.first._M_dataplus._M_p != &local_a0.first.field_2) {
      operator_delete(local_a0.first._M_dataplus._M_p);
      puVar3 = extraout_RDX_02;
    }
    if ((puStack_a8 != (uint *)0x0) && (*puStack_a8 = *puStack_a8 - 1, *puStack_a8 == 0)) {
      if (local_b0 != (destructible *)0x0) {
        (*local_b0->_vptr_destructible[1])();
        puVar3 = extraout_RDX_03;
      }
      if (puStack_a8 != (uint *)0x0) {
        operator_delete(puStack_a8);
        puVar3 = extraout_RDX_04;
      }
    }
    local_b0 = (destructible *)0x0;
    puStack_a8 = (uint *)0x0;
    if (local_d0 != local_c0) {
      operator_delete(local_d0);
      puVar3 = extraout_RDX_05;
    }
    if ((puStack_e0 != (uint *)0x0) && (*puStack_e0 = *puStack_e0 - 1, *puStack_e0 == 0)) {
      if (local_e8 != (destructible *)0x0) {
        (*local_e8->_vptr_destructible[1])();
        puVar3 = extraout_RDX_06;
      }
      if (puStack_e0 != (uint *)0x0) {
        operator_delete(puStack_e0);
        puVar3 = extraout_RDX_07;
      }
    }
    if (local_70 != local_60) {
      operator_delete(local_70);
      puVar3 = extraout_RDX_08;
    }
  }
  p_Var1 = pVar4.first._M_node._M_node[2]._M_parent;
  (this->_test_cases).
  super__Vector_base<ut::shared_ptr<ut::test_case,_unsigned_int>,_std::allocator<ut::shared_ptr<ut::test_case,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_start = *(pointer *)(pVar4.first._M_node._M_node + 2);
  (this->_test_cases).
  super__Vector_base<ut::shared_ptr<ut::test_case,_unsigned_int>,_std::allocator<ut::shared_ptr<ut::test_case,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)p_Var1;
  if (p_Var1 != (_Base_ptr)0x0) {
    p_Var1->_M_color = p_Var1->_M_color + 1;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
    puVar3 = extraout_RDX_09;
  }
  sVar5._refcount = puVar3;
  sVar5._ptr = (setup_impl<agge::tests::PreciseDeltaTests> *)this;
  return sVar5;
}

Assistant:

inline shared_ptr< setup_impl< FixtureT > > registry::get_setup()
	{
		typedef setup_impl<FixtureT> fixture_setup;

		const std::string id = FixtureT::__suite_id();
		_setups_map_t::const_iterator s = _setups.find(id);

		s = s == _setups.end() ?
			_setups.insert(std::make_pair(id, shared_ptr<destructible>(new fixture_setup))).first : s;
		return shared_ptr<fixture_setup>(static_pointer_cast< fixture_setup >(s->second));
	}